

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixShmUnmap(sqlite3_file *fd,int deleteFlag)

{
  sqlite3_io_methods *p_00;
  long lVar1;
  unixFile *pDbFd;
  unixShm **pp;
  unixShmNode *pShmNode;
  unixShm *p;
  int deleteFlag_local;
  sqlite3_file *fd_local;
  
  p_00 = fd[8].pMethods;
  if (p_00 != (sqlite3_io_methods *)0x0) {
    lVar1 = *(long *)p_00;
    sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar1 + 8));
    for (pDbFd = (unixFile *)(lVar1 + 0x38); pDbFd->pMethod != p_00;
        pDbFd = (unixFile *)&pDbFd->pMethod->xClose) {
    }
    pDbFd->pMethod = (sqlite3_io_methods *)p_00->xClose;
    sqlite3_free(p_00);
    fd[8].pMethods = (sqlite3_io_methods *)0x0;
    sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar1 + 8));
    unixEnterMutex();
    *(int *)(lVar1 + 0x30) = *(int *)(lVar1 + 0x30) + -1;
    if (*(int *)(lVar1 + 0x30) == 0) {
      if ((deleteFlag != 0) && (-1 < *(int *)(lVar1 + 0x18))) {
        (*aSyscall[0x10].pCurrent)(*(undefined8 *)(lVar1 + 0x10));
      }
      unixShmPurge((unixFile *)fd);
    }
    unixLeaveMutex();
  }
  return 0;
}

Assistant:

static int unixShmUnmap(
  sqlite3_file *fd,               /* The underlying database file */
  int deleteFlag                  /* Delete shared-memory if true */
){
  unixShm *p;                     /* The connection to be closed */
  unixShmNode *pShmNode;          /* The underlying shared-memory file */
  unixShm **pp;                   /* For looping over sibling connections */
  unixFile *pDbFd;                /* The underlying database file */

  pDbFd = (unixFile*)fd;
  p = pDbFd->pShm;
  if( p==0 ) return SQLITE_OK;
  pShmNode = p->pShmNode;

  assert( pShmNode==pDbFd->pInode->pShmNode );
  assert( pShmNode->pInode==pDbFd->pInode );

  /* Remove connection p from the set of connections associated
  ** with pShmNode */
  sqlite3_mutex_enter(pShmNode->pShmMutex);
  for(pp=&pShmNode->pFirst; (*pp)!=p; pp = &(*pp)->pNext){}
  *pp = p->pNext;

  /* Free the connection p */
  sqlite3_free(p);
  pDbFd->pShm = 0;
  sqlite3_mutex_leave(pShmNode->pShmMutex);

  /* If pShmNode->nRef has reached 0, then close the underlying
  ** shared-memory file, too */
  assert( unixFileMutexNotheld(pDbFd) );
  unixEnterMutex();
  assert( pShmNode->nRef>0 );
  pShmNode->nRef--;
  if( pShmNode->nRef==0 ){
    if( deleteFlag && pShmNode->hShm>=0 ){
      osUnlink(pShmNode->zFilename);
    }
    unixShmPurge(pDbFd);
  }
  unixLeaveMutex();

  return SQLITE_OK;
}